

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O0

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,CConstExpression *expression)

{
  int __val;
  allocator local_89;
  string local_88 [48];
  __cxx11 local_58 [32];
  undefined1 local_38 [40];
  CConstExpression *expression_local;
  PrintVisitor *this_local;
  
  this->lastVisited = this->lastVisited + 1;
  local_38._32_8_ = expression;
  expression_local = (CConstExpression *)this;
  __val = CConstExpression::getValue(expression);
  std::__cxx11::to_string(local_58,__val);
  ConstructLabel((PrintVisitor *)local_38,(string *)this,(int)local_58);
  std::__cxx11::string::operator=((string *)&this->description,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)local_58);
  AddArrow(this,this->lastVisited);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Const",&local_89);
  AddLabel(this,(string *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  this->lastVisited = this->lastVisited + 1;
  return;
}

Assistant:

void IRT::PrintVisitor::Visit( const IRT::CConstExpression &expression ) {
    ++lastVisited;
    description = ConstructLabel( std::to_string( expression.getValue( )), lastVisited );
    AddArrow( lastVisited );
    AddLabel( "Const" );
    ++lastVisited;
}